

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

uint8_t * __thiscall
proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator::_InternalSerialize
          (TestParsingMergeLite_RepeatedFieldsGenerator *this,uint8_t *target,
          EpsCopyOutputStream *stream)

{
  int iVar1;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite>_> *pVVar2;
  uint8_t *puVar3;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group1>_>
  *value;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2>_>
  *value_00;
  ulong uVar4;
  int iVar5;
  
  iVar1 = *(int *)((long)&this->field_0 + 8);
  for (iVar5 = 0; iVar1 != iVar5; iVar5 = iVar5 + 1) {
    pVVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite>>
                       ((RepeatedPtrFieldBase *)&(this->field_0)._impl_,iVar5);
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (1,&pVVar2->super_MessageLite,(pVVar2->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x20);
  for (iVar5 = 0; iVar1 != iVar5; iVar5 = iVar5 + 1) {
    pVVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite>>
                       (&(this->field_0)._impl_.field2_.super_RepeatedPtrFieldBase,iVar5);
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (2,&pVVar2->super_MessageLite,(pVVar2->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x38);
  for (iVar5 = 0; iVar1 != iVar5; iVar5 = iVar5 + 1) {
    pVVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite>>
                       (&(this->field_0)._impl_.field3_.super_RepeatedPtrFieldBase,iVar5);
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (3,&pVVar2->super_MessageLite,(pVVar2->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x50);
  for (iVar5 = 0; iVar1 != iVar5; iVar5 = iVar5 + 1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group1>>
                      (&(this->field_0)._impl_.group1_.super_RepeatedPtrFieldBase,iVar5);
    target = google::protobuf::internal::WireFormatLite::InternalWriteGroup
                       (10,&value->super_MessageLite,puVar3,stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x68);
  for (iVar5 = 0; iVar1 != iVar5; iVar5 = iVar5 + 1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    value_00 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2>>
                         (&(this->field_0)._impl_.group2_.super_RepeatedPtrFieldBase,iVar5);
    target = google::protobuf::internal::WireFormatLite::InternalWriteGroup
                       (0x14,&value_00->super_MessageLite,puVar3,stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x80);
  for (iVar5 = 0; iVar1 != iVar5; iVar5 = iVar5 + 1) {
    pVVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite>>
                       (&(this->field_0)._impl_.ext1_.super_RepeatedPtrFieldBase,iVar5);
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (1000,&pVVar2->super_MessageLite,(pVVar2->field_0)._impl_._cached_size_.atom_
                        ,target,stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x98);
  for (iVar5 = 0; iVar1 != iVar5; iVar5 = iVar5 + 1) {
    pVVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite>>
                       (&(this->field_0)._impl_.ext2_.super_RepeatedPtrFieldBase,iVar5);
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (0x3e9,&pVVar2->super_MessageLite,
                        (pVVar2->field_0)._impl_._cached_size_.atom_,target,stream);
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) == 0) {
    return target;
  }
  uVar4 = uVar4 & 0xfffffffffffffffe;
  puVar3 = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                     (stream,*(void **)(uVar4 + 8),*(int *)(uVar4 + 0x10),target);
  return puVar3;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestParsingMergeLite_RepeatedFieldsGenerator::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestParsingMergeLite_RepeatedFieldsGenerator& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestParsingMergeLite.RepeatedFieldsGenerator)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated .proto2_unittest.TestAllTypesLite field1 = 1;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_field1_size());
       i < n; i++) {
    const auto& repfield = this_._internal_field1().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            1, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .proto2_unittest.TestAllTypesLite field2 = 2;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_field2_size());
       i < n; i++) {
    const auto& repfield = this_._internal_field2().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            2, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .proto2_unittest.TestAllTypesLite field3 = 3;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_field3_size());
       i < n; i++) {
    const auto& repfield = this_._internal_field3().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            3, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .proto2_unittest.TestParsingMergeLite.RepeatedFieldsGenerator.Group1 group1 = 10 [features = {
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_group1_size());
       i < n; i++) {
    target = stream->EnsureSpace(target);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteGroup(
            10, this_._internal_group1().Get(i),
            target, stream);
  }

  // repeated .proto2_unittest.TestParsingMergeLite.RepeatedFieldsGenerator.Group2 group2 = 20 [features = {
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_group2_size());
       i < n; i++) {
    target = stream->EnsureSpace(target);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteGroup(
            20, this_._internal_group2().Get(i),
            target, stream);
  }

  // repeated .proto2_unittest.TestAllTypesLite ext1 = 1000;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_ext1_size());
       i < n; i++) {
    const auto& repfield = this_._internal_ext1().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            1000, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .proto2_unittest.TestAllTypesLite ext2 = 1001;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_ext2_size());
       i < n; i++) {
    const auto& repfield = this_._internal_ext2().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            1001, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestParsingMergeLite.RepeatedFieldsGenerator)
  return target;
}